

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_compaction_test.cc
# Opt level: O3

void multi_writers(char *test_name)

{
  size_t *filename;
  kvs_ops_stat **kvs_name;
  timeval b;
  fdb_status fVar1;
  int iVar2;
  fdb_config *pfVar3;
  uint uVar4;
  ulong unaff_RBP;
  char *__format;
  fdb_kvs_handle *pfVar5;
  undefined8 unaff_R12;
  long lVar6;
  long *unaff_R13;
  timeval *unaff_R14;
  long unaff_R15;
  bool bVar7;
  timeval tVar8;
  fdb_file_handle *dbfile;
  timeval ts_begin;
  timeval ts_cur;
  timeval __test_begin;
  fdb_file_handle *pfStack_19d8;
  fdb_kvs_handle *pfStack_19d0;
  fdb_kvs_handle *pfStack_19c8;
  kvs_ops_stat **ppkStack_19c0;
  fdb_kvs_handle *pfStack_19b8;
  long lStack_19b0;
  fdb_kvs_handle *pfStack_19a8;
  fdb_kvs_config fStack_19a0;
  fdb_doc fStack_1980;
  char acStack_1930 [8];
  char acStack_1928 [8];
  char acStack_1920 [32];
  timeval tStack_1900;
  char acStack_18f0 [408];
  fdb_config fStack_1758;
  char acStack_1660 [264];
  fdb_config *pfStack_1558;
  undefined8 uStack_1550;
  long *plStack_1548;
  timeval *ptStack_1540;
  long lStack_1538;
  code *pcStack_1530;
  fdb_kvs_handle *local_1520;
  list *local_1518 [2];
  char *local_1508;
  undefined1 local_1500 [16];
  undefined1 local_14f0 [40];
  timeval local_14c8;
  pthread_t apStack_14b8 [7];
  timeval local_1480 [5];
  fdb_config local_1430;
  undefined4 local_1338 [2];
  undefined1 local_1330 [4280];
  long local_278 [3];
  undefined1 local_260 [248];
  uint32_t local_168 [4];
  uint64_t local_158;
  char local_150 [256];
  char acStack_50 [16];
  undefined1 local_40 [16];
  
  pcStack_1530 = (code *)0x10518a;
  local_1508 = test_name;
  gettimeofday(&local_14c8,(__timezone_ptr_t)0x0);
  pcStack_1530 = (code *)0x10518f;
  memleak_start();
  pcStack_1530 = (code *)0x10519b;
  system("rm -rf ./big_file* > errorlog.txt");
  pcStack_1530 = (code *)0x1051c4;
  printf("\nLoading %lu docs %d key length %d bodylen. Buffercache %luMB. Target docsize %luMB...",
         0x964fda,200,10,0x14,0x800);
  pcStack_1530 = (code *)0x1051d0;
  gettimeofday((timeval *)local_1500,(__timezone_ptr_t)0x0);
  pfVar3 = &local_1430;
  pcStack_1530 = (code *)0x1051e0;
  fdb_get_default_config();
  local_1430.multi_kv_instances = true;
  local_1430.buffercache_size = 0x1400000;
  local_1430.durability_opt = '\x01';
  pfVar5 = (fdb_kvs_handle *)&local_1520;
  pcStack_1530 = (code *)0x105204;
  fVar1 = fdb_open((fdb_file_handle **)pfVar5,"./big_file",pfVar3);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    unaff_R15 = 0x8385dd;
    unaff_RBP = 7;
    unaff_R14 = local_1480;
    lVar6 = 0;
    do {
      unaff_R13 = (long *)((long)local_278 + lVar6);
      *(long *)((long)local_278 + lVar6 + 8) = unaff_R15;
      *unaff_R13 = unaff_R15 + 0x12c9fa;
      pcStack_1530 = (code *)0x105259;
      memcpy(local_260 + lVar6,&local_1430,0xf8);
      pcStack_1530 = (code *)0x105263;
      fdb_get_default_kvs_config();
      *(undefined8 *)((long)&local_158 + lVar6) = local_14f0._16_8_;
      *(undefined4 *)((long)local_168 + lVar6) = local_14f0._0_4_;
      *(undefined4 *)((long)local_168 + lVar6 + 4) = local_14f0._4_4_;
      *(undefined4 *)((long)local_168 + lVar6 + 8) = local_14f0._8_4_;
      *(undefined4 *)((long)local_168 + lVar6 + 0xc) = local_14f0._12_4_;
      *(undefined8 *)((long)local_278 + lVar6 + 0x10) = 0x267a;
      local_40[lVar6] = 1;
      pcStack_1530 = (code *)0x1052a9;
      sprintf(local_150 + lVar6,"%s_%d.0","./big_file",unaff_RBP);
      pcStack_1530 = (code *)0x1052c4;
      sprintf(acStack_50 + lVar6,"kv_%d",0);
      pcStack_1530 = (code *)0x1052d8;
      pthread_create((pthread_t *)unaff_R14,(pthread_attr_t *)0x0,_writer_thread,unaff_R13);
      lVar6 = lVar6 + -0x240;
      unaff_R15 = unaff_R15 + -0x12c9fb;
      unaff_R14 = (timeval *)&unaff_R14[-1].tv_usec;
      unaff_RBP = (ulong)((int)unaff_RBP - 1);
    } while (lVar6 != -0x1200);
    local_1338[0] = 8;
    pcStack_1530 = (code *)0x10531a;
    memcpy(local_1330,&local_1430,0xf8);
    lVar6 = 0;
    pcStack_1530 = (code *)0x105337;
    pthread_create((pthread_t *)local_1518,(pthread_attr_t *)0x0,_compactor_thread,local_1338);
    do {
      pcStack_1530 = (code *)0x10534c;
      pthread_join(*(pthread_t *)((long)apStack_14b8 + lVar6),
                   (void **)((long)&local_1480[0].tv_usec + lVar6));
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x40);
    local_1338[0] = 0;
    pcStack_1530 = (code *)0x105370;
    pthread_join((pthread_t)local_1518[0],(void **)(local_14f0 + 0x18));
    pcStack_1530 = (code *)0x10537f;
    pfVar5 = local_1520;
    fVar1 = fdb_commit((fdb_file_handle *)local_1520,'\x01');
    unaff_R12 = 0xffffffffffffee00;
    pfVar3 = (fdb_config *)0x40;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001054b7;
    unaff_R14 = (timeval *)local_14f0;
    pcStack_1530 = (code *)0x105396;
    gettimeofday(unaff_R14,(__timezone_ptr_t)0x0);
    pfVar3 = (fdb_config *)local_1500;
    tVar8.tv_sec._4_4_ = local_14f0._4_4_;
    tVar8.tv_sec._0_4_ = local_14f0._0_4_;
    tVar8.tv_usec._0_4_ = local_14f0._8_4_;
    tVar8.tv_usec._4_4_ = local_14f0._12_4_;
    pcStack_1530 = (code *)0x1053ae;
    tVar8 = _utime_gap((timeval)local_1500,tVar8);
    pcStack_1530 = (code *)0x1053ce;
    printf("\nFile created %lu docs loaded (keylen %d doclen %d) in%ldsec",0x964fda,200,10,
           tVar8.tv_sec);
    pcStack_1530 = (code *)0x1053dc;
    printf("\nStarting compaction...");
    pcStack_1530 = (code *)0x1053e6;
    putchar(10);
    pcStack_1530 = (code *)0x1053f0;
    gettimeofday((timeval *)pfVar3,(__timezone_ptr_t)0x0);
    pcStack_1530 = (code *)0x105401;
    pfVar5 = local_1520;
    fVar1 = fdb_compact_with_cow((fdb_file_handle *)local_1520,"./big_file2");
    if (fVar1 == FDB_RESULT_COMPACTION_FAIL) {
      pcStack_1530 = (code *)0x105417;
      pfVar5 = local_1520;
      fVar1 = fdb_compact((fdb_file_handle *)local_1520,"./big_file2");
    }
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001054bc;
    pfVar3 = (fdb_config *)local_14f0;
    pcStack_1530 = (code *)0x10542e;
    gettimeofday((timeval *)pfVar3,(__timezone_ptr_t)0x0);
    b.tv_sec._4_4_ = local_14f0._4_4_;
    b.tv_sec._0_4_ = local_14f0._0_4_;
    b.tv_usec._0_4_ = local_14f0._8_4_;
    b.tv_usec._4_4_ = local_14f0._12_4_;
    pcStack_1530 = (code *)0x105444;
    tVar8 = _utime_gap((timeval)local_1500,b);
    pcStack_1530 = (code *)0x105455;
    printf("\nCompaction completed in %ld seconds\n",tVar8.tv_sec,tVar8.tv_usec);
    pcStack_1530 = (code *)0x10545f;
    fVar1 = fdb_close((fdb_file_handle *)local_1520);
    pfVar5 = local_1520;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_1530 = (code *)0x105468;
      fVar1 = fdb_shutdown();
      pfVar5 = local_1520;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcStack_1530 = (code *)0x105471;
        memleak_end();
        __format = "%s PASSED\n";
        if (multi_writers(char_const*)::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        pcStack_1530 = (code *)0x1054a0;
        fprintf(_stderr,__format,local_1508);
        return;
      }
      goto LAB_001054c6;
    }
  }
  else {
    pcStack_1530 = (code *)0x1054b7;
    multi_writers();
LAB_001054b7:
    pcStack_1530 = (code *)0x1054bc;
    multi_writers();
LAB_001054bc:
    pcStack_1530 = (code *)0x1054c1;
    multi_writers();
  }
  pcStack_1530 = (code *)0x1054c6;
  multi_writers();
LAB_001054c6:
  pcStack_1530 = _writer_thread;
  multi_writers();
  pfStack_1558 = pfVar3;
  uStack_1550 = unaff_R12;
  plStack_1548 = unaff_R13;
  ptStack_1540 = unaff_R14;
  lStack_1538 = unaff_R15;
  pcStack_1530 = (code *)unaff_RBP;
  gettimeofday(&tStack_1900,(__timezone_ptr_t)0x0);
  memcpy(&fStack_1758,&pfVar5->kvs,0xf8);
  fStack_19a0.custom_cmp_param = *(void **)((pfVar5->config).encryption_key.bytes + 0x1c);
  pfVar3 = &pfVar5->config;
  fStack_19a0.create_if_missing = (bool)(pfVar3->encryption_key).bytes[0xc];
  fStack_19a0._1_1_ = (pfVar3->encryption_key).bytes[0xd];
  fStack_19a0._2_1_ = (pfVar3->encryption_key).bytes[0xe];
  fStack_19a0._3_1_ = (pfVar3->encryption_key).bytes[0xf];
  fStack_19a0._4_1_ = (pfVar3->encryption_key).bytes[0x10];
  fStack_19a0._5_1_ = (pfVar3->encryption_key).bytes[0x11];
  fStack_19a0._6_1_ = (pfVar3->encryption_key).bytes[0x12];
  fStack_19a0._7_1_ = (pfVar3->encryption_key).bytes[0x13];
  fStack_19a0.custom_cmp =
       *(fdb_custom_cmp_variable *)((pfVar5->config).encryption_key.bytes + 0x14);
  filename = &(pfVar5->config).block_reusing_threshold;
  fVar1 = fdb_open(&pfStack_19d8,(char *)filename,&fStack_1758);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0x7a);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                  ,0x7a,"void *_writer_thread(void *)");
  }
  kvs_name = &pfVar5[1].op_stats;
  fVar1 = fdb_kvs_open(pfStack_19d8,&pfStack_19c8,(char *)kvs_name,&fStack_19a0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0x7e);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                  ,0x7e,"void *_writer_thread(void *)");
  }
  sprintf(acStack_18f0,"%s_back",kvs_name);
  fVar1 = fdb_kvs_open(pfStack_19d8,&pfStack_19a8,acStack_18f0,&fStack_19a0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0x84);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                  ,0x84,"void *_writer_thread(void *)");
  }
  fVar1 = fdb_set_log_callback(pfStack_19c8,logCallbackFunc,filename);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fStack_1980.size_ondisk = 0;
    fStack_1980.meta = (void *)0x0;
    fStack_1980.metalen = 0;
    fStack_1980.seqnum = 0;
    fStack_1980.offset = 0;
    fStack_1980.deleted = false;
    fStack_1980._73_3_ = 0;
    fStack_1980.flags = 0;
    fStack_1980.keylen = 200;
    fStack_1980.body = acStack_1920;
    fStack_1980.bodylen = 10;
    ppkStack_19c0 = kvs_name;
    fStack_1980.key = acStack_18f0;
    printf("\nWriter thread:load %lu docs from %lu to %lu\n",
           (long)*(fdb_kvs_handle **)&pfVar5->kvs_config - (long)(pfVar5->kvs_config).custom_cmp);
    uVar4 = *(int *)&pfVar5->kvs_config - 1;
    lVar6 = (long)(int)uVar4;
    if ((long)(pfVar5->kvs_config).custom_cmp <= lVar6) {
      pfStack_19b8 = pfVar5;
      do {
        lStack_19b0 = lVar6;
        iVar2 = rand();
        sprintf(acStack_1928,"%%%dd",(ulong)(iVar2 % 200 + 1));
        sprintf(acStack_18f0,acStack_1928,(ulong)uVar4);
        sprintf(acStack_1930,"%%%dd",10);
        sprintf(acStack_1920,acStack_1930,(ulong)uVar4);
        fStack_1980.keylen = (size_t)(iVar2 % 200 + 2);
        fVar1 = fdb_set(pfStack_19c8,&fStack_1980);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                  ,0x9c);
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                        ,0x9c,"void *_writer_thread(void *)");
        }
        fVar1 = fdb_set(pfStack_19a8,&fStack_1980);
        pfVar5 = pfStack_19b8;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                  ,0xa0);
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                        ,0xa0,"void *_writer_thread(void *)");
        }
        bVar7 = uVar4 != 0;
        uVar4 = uVar4 - 1;
        if ((bVar7) && (lStack_19b0 % (long)(pfStack_19b8->kvs_config).custom_cmp_param == 0)) {
          sprintf(acStack_1660,"%s_meta",ppkStack_19c0);
          fVar1 = fdb_kvs_open(pfStack_19d8,&pfStack_19d0,acStack_1660,&fStack_19a0);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                    ,0xa8);
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                          ,0xa8,"void *_writer_thread(void *)");
          }
          builtin_strncpy(acStack_18f0,"foo",4);
          fStack_1980.keylen = 3;
          fVar1 = fdb_set(pfStack_19d0,&fStack_1980);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                    ,0xac);
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                          ,0xac,"void *_writer_thread(void *)");
          }
          fdb_kvs_close(pfStack_19d0);
          fVar1 = fdb_commit(pfStack_19d8,*(fdb_commit_opt_t *)&pfVar5[1].trie);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                    ,0xb0);
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                          ,0xb0,"void *_writer_thread(void *)");
          }
        }
        lVar6 = (long)(int)uVar4;
      } while ((long)(pfVar5->kvs_config).custom_cmp <= lVar6);
    }
    fdb_close(pfStack_19d8);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
          ,0x87);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                ,0x87,"void *_writer_thread(void *)");
}

Assistant:

void multi_writers(const char *test_name) {
    TEST_INIT();
    memleak_start();

    int num_writers = NUM_WRITERS;
    int64_t writer_shard_size = NUM_DOCS / NUM_WRITERS;
    fdb_file_handle *dbfile;
    fdb_config fconfig;
    int r;
    fdb_status status;
    struct writer_thread_args *wargs = alca(struct writer_thread_args,
                                       num_writers);
    thread_t *tid = alca(thread_t, num_writers);
    thread_t *compactor_tid = alca(thread_t, 1);
    void **compactor_ret = alca(void *, 1);
    struct compactor_thread_args *cargs = alca(struct compactor_thread_args, 1);
    void **thread_ret = alca(void *, num_writers);
    struct timeval ts_begin, ts_cur, ts_gap;

    // remove previous test files
    r = system(SHELL_DEL TEST_FILENAME "* > errorlog.txt");
    (void) r;

    printf("\nLoading %" _F64 " docs %d key length %d bodylen."
           " Buffercache %" _F64 "MB. Target docsize %" _F64 "MB...",
            NUM_DOCS, MAX_KEY_LEN, BODY_LEN,
            BUFFERCACHE_SIZE ? (uint64_t)BUFFERCACHE_SIZE/ (1024 * 1024) : 0,
            (uint64_t)(MAX_KEY_LEN + BODY_LEN + 8) * NUM_DOCS / (1024 * 1024));
    gettimeofday(&ts_begin, NULL);

    fconfig = fdb_get_default_config();
    fconfig.multi_kv_instances = MULTI_KV;
    fconfig.buffercache_size = BUFFERCACHE_SIZE;
    fconfig.durability_opt = FDB_DRB_ODIRECT;
    status = fdb_open(&dbfile, TEST_FILENAME, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (int i = num_writers - 1; i >= 0; --i) {
        // Writer Thread Config:
        wargs[i].docid_low = i*writer_shard_size;
        wargs[i].docid_high = ((i + 1) * writer_shard_size) - 1;
        wargs[i].config = fconfig;
        wargs[i].kvs_config = fdb_get_default_kvs_config();
        wargs[i].batch_size = NUM_DOCS / 1000;
        wargs[i].commit_opt = FDB_COMMIT_MANUAL_WAL_FLUSH;
        sprintf(wargs[i].test_file_name, "%s_%d.0", TEST_FILENAME, i);
        sprintf(wargs[i].kv_store_name, "kv_%d", 0);

        thread_create(&tid[i], _writer_thread, &wargs[i]);
    }

    cargs->num_files = num_writers;
    cargs->config = fconfig;
    thread_create(compactor_tid, _compactor_thread, cargs);

    // wait for thread termination
    for (int i = 0; i < num_writers; ++i) {
        thread_join(tid[i], &thread_ret[i]);
    }
    cargs->num_files = 0; // ask compactor to stop
    thread_join(*compactor_tid, compactor_ret);

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    gettimeofday(&ts_cur, NULL);
    ts_gap = _utime_gap(ts_begin, ts_cur);

    printf("\nFile created %" _F64 " docs loaded (keylen %d doclen %d) in"
           "%ldsec", NUM_DOCS, MAX_KEY_LEN, BODY_LEN, ts_gap.tv_sec);

    printf("\nStarting compaction...");
    printf("\n"); // flush stdio buffer
    gettimeofday(&ts_begin, NULL);

    status = fdb_compact_with_cow(dbfile, TEST_FILENAME "2");
    if (status == FDB_RESULT_COMPACTION_FAIL) {
        status = fdb_compact(dbfile, TEST_FILENAME "2");
    }
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    gettimeofday(&ts_cur, NULL);
    ts_gap = _utime_gap(ts_begin, ts_cur);

    printf("\nCompaction completed in %ld seconds\n", ts_gap.tv_sec);

    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // shutdown
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT(test_name);
}